

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_13::NameResolver::ResolveVar
          (NameResolver *this,BindingHash *bindings,Var *var,char *desc)

{
  Index index;
  
  if (var->type_ != Name) {
    return;
  }
  index = BindingHash::FindIndex(bindings,var);
  if (index != 0xffffffff) {
    Var::set_index(var,index);
    return;
  }
  if (var->type_ == Name) {
    PrintError(this,&var->loc,"undefined %s variable \"%s\"",desc,
               (var->field_2).name_._M_dataplus._M_p);
    return;
  }
  __assert_fail("is_name()",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/ir.h"
                ,0x37,"const std::string &wabt::Var::name() const");
}

Assistant:

void NameResolver::ResolveVar(const BindingHash* bindings,
                              Var* var,
                              const char* desc) {
  if (var->is_name()) {
    Index index = bindings->FindIndex(*var);
    if (index == kInvalidIndex) {
      PrintError(&var->loc, "undefined %s variable \"%s\"", desc,
                 var->name().c_str());
      return;
    }

    var->set_index(index);
  }
}